

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::prepCombinedMemory(MultiMemoryLowering *this)

{
  Module *pMVar1;
  bool bVar2;
  Memory *pMVar3;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *this_00;
  pointer pMVar4;
  address64_t aVar5;
  address64_t aVar6;
  pointer pEVar7;
  IString *this_01;
  uint64_t a;
  string_view local_3a8;
  IString local_398;
  Fatal local_388;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *local_200;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2_1;
  Address local_1d8;
  Address maxSize;
  Fatal local_1c0;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *memory;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
  *__range2;
  MultiMemoryLowering *local_10;
  MultiMemoryLowering *this_local;
  
  local_10 = this;
  pMVar3 = getFirstMemory(this);
  (this->pointerType).id = (pMVar3->addressType).id;
  __range2._4_4_ = 2;
  bVar2 = wasm::Type::operator==(&this->pointerType,(BasicType *)((long)&__range2 + 4));
  this->memoryInfo = (uint)!bVar2;
  pMVar3 = getFirstMemory(this);
  this->isShared = (bool)(pMVar3->shared & 1);
  pMVar3 = getFirstMemory(this);
  bVar2 = Importable::imported(&pMVar3->super_Importable);
  this->isImported = bVar2;
  this_00 = &this->wasm->memories;
  __end2 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::begin(this_00);
  memory = (unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)
           std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
                                     *)&memory), bVar2) {
    local_38 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
               ::operator*(&__end2);
    pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(local_38)
    ;
    if ((pMVar4->shared & 1U) != (this->isShared & 1U)) {
      __assert_fail("memory->shared == isShared",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                    ,0x1b9,"void wasm::MultiMemoryLowering::prepCombinedMemory()");
    }
    pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(local_38)
    ;
    bVar2 = wasm::Type::operator==(&pMVar4->addressType,&this->pointerType);
    if (!bVar2) {
      __assert_fail("memory->addressType == pointerType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MultiMemoryLowering.cpp"
                    ,0x1ba,"void wasm::MultiMemoryLowering::prepCombinedMemory()");
    }
    pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(local_38)
    ;
    pMVar3 = getFirstMemory(this);
    bVar2 = IString::operator!=((IString *)pMVar4,(IString *)pMVar3);
    if (bVar2) {
      pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (local_38);
      bVar2 = Importable::imported(&pMVar4->super_Importable);
      if (bVar2) {
        Fatal::Fatal(&local_1c0);
        Fatal::operator<<(&local_1c0,
                          (char (*) [59])
                          "MultiMemoryLowering: only the first memory can be imported");
        Fatal::~Fatal(&local_1c0);
      }
    }
    aVar5 = wasm::Address::operator_cast_to_unsigned_long(&this->totalInitialPages);
    pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(local_38)
    ;
    aVar6 = wasm::Address::operator_cast_to_unsigned_long(&pMVar4->initial);
    wasm::Address::operator=(&this->totalInitialPages,aVar5 + aVar6);
    pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(local_38)
    ;
    bVar2 = Memory::hasMax(pMVar4);
    if (bVar2) {
      aVar5 = wasm::Address::operator_cast_to_unsigned_long(&this->totalMaxPages);
      pMVar4 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (local_38);
      aVar6 = wasm::Address::operator_cast_to_unsigned_long(&pMVar4->max);
      wasm::Address::operator=(&this->totalMaxPages,aVar5 + aVar6);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_*,_std::vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>_>
    ::operator++(&__end2);
  }
  __range2_1._4_4_ = 2;
  bVar2 = wasm::Type::operator==(&this->pointerType,(BasicType *)((long)&__range2_1 + 4));
  a = 0x1000000000000;
  if (bVar2) {
    a = 0x10000;
  }
  wasm::Address::Address(&local_1d8,a);
  aVar5 = wasm::Address::operator_cast_to_unsigned_long(&this->totalMaxPages);
  aVar6 = wasm::Address::operator_cast_to_unsigned_long(&local_1d8);
  if ((aVar6 < aVar5) ||
     (aVar5 = wasm::Address::operator_cast_to_unsigned_long(&this->totalMaxPages), aVar5 == 0)) {
    wasm::Address::operator=(&this->totalMaxPages,0xffffffffffffffff);
  }
  aVar5 = wasm::Address::operator_cast_to_unsigned_long(&this->totalInitialPages);
  aVar6 = wasm::Address::operator_cast_to_unsigned_long(&this->totalMaxPages);
  if (aVar6 < aVar5) {
    (this->totalInitialPages).addr = (this->totalMaxPages).addr;
  }
  if ((this->isImported & 1U) != 0) {
    pMVar3 = getFirstMemory(this);
    wasm::Name::operator=(&this->module,&(pMVar3->super_Importable).module);
    pMVar3 = getFirstMemory(this);
    wasm::Name::operator=(&this->base,&(pMVar3->super_Importable).base);
  }
  pMVar1 = this->wasm;
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ::begin(&pMVar1->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&pMVar1->exports);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                        *)&exp);
    if (!bVar2) {
      pMVar1 = this->wasm;
      wasm::Name::Name((Name *)&local_3a8,"combined_memory");
      local_398.str = (string_view)Names::getValidMemoryName(pMVar1,local_3a8);
      wasm::Name::operator=(&this->combinedMemory,(Name *)&local_398);
      return;
    }
    local_200 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                ::operator*(&__end2_1);
    pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       (local_200);
    if (pEVar7->kind == Memory) {
      pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_200);
      this_01 = &Export::getInternalName(pEVar7)->super_IString;
      pMVar3 = getFirstMemory(this);
      bVar2 = IString::operator==(this_01,(IString *)pMVar3);
      if (!bVar2) goto LAB_01ee7f13;
      this->isExported = true;
    }
    else {
LAB_01ee7f13:
      pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (local_200);
      if (pEVar7->kind == Memory) {
        Fatal::Fatal(&local_388);
        Fatal::operator<<(&local_388,
                          (char (*) [59])
                          "MultiMemoryLowering: only the first memory can be exported");
        Fatal::~Fatal(&local_388);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void prepCombinedMemory() {
    pointerType = getFirstMemory().addressType;
    memoryInfo = pointerType == Type::i32 ? Builder::MemoryInfo::Memory32
                                          : Builder::MemoryInfo::Memory64;
    isShared = getFirstMemory().shared;
    isImported = getFirstMemory().imported();
    for (auto& memory : wasm->memories) {
      // We are assuming that each memory is configured the same as the first
      // and assert if any of the memories does not match this configuration
      assert(memory->shared == isShared);
      assert(memory->addressType == pointerType);

      // TODO: handle memory import for memories other than the first
      if (memory->name != getFirstMemory().name && memory->imported()) {
        Fatal() << "MultiMemoryLowering: only the first memory can be imported";
      }

      // Calculating the total initial and max page size for the combined memory
      // by totaling the initial and max page sizes for the memories in the
      // module
      totalInitialPages = totalInitialPages + memory->initial;
      if (memory->hasMax()) {
        totalMaxPages = totalMaxPages + memory->max;
      }
    }
    // Ensuring valid initial and max page sizes that do not exceed the number
    // of pages addressable by the pointerType
    Address maxSize =
      pointerType == Type::i32 ? Memory::kMaxSize32 : Memory::kMaxSize64;
    if (totalMaxPages > maxSize || totalMaxPages == 0) {
      totalMaxPages = Memory::kUnlimitedSize;
    }
    if (totalInitialPages > totalMaxPages) {
      totalInitialPages = totalMaxPages;
    }

    // Save the module and base to set on the combinedMemory
    if (isImported) {
      module = getFirstMemory().module;
      base = getFirstMemory().base;
    }
    // Ensuring only the first memory is an exported memory
    for (auto& exp : wasm->exports) {
      if (exp->kind == ExternalKind::Memory &&
          *exp->getInternalName() == getFirstMemory().name) {
        isExported = true;
      } else if (exp->kind == ExternalKind::Memory) {
        Fatal() << "MultiMemoryLowering: only the first memory can be exported";
      }
    }
    // Creating the combined memory name so we can reference the combined memory
    // in subsequent instructions before it is added to the module
    combinedMemory = Names::getValidMemoryName(*wasm, "combined_memory");
  }